

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O2

void __thiscall
TCLAP::ValueArg<double>::ValueArg
          (ValueArg<double> *this,string *flag,string *name,string *desc,bool req,double val,
          string *typeDesc,CmdLineInterface *parser,Visitor *v)

{
  Arg::Arg(&this->super_Arg,flag,name,desc,req,true,v);
  (this->super_Arg)._vptr_Arg = (_func_int **)&PTR__ValueArg_00130c20;
  this->_value = val;
  this->_default = val;
  std::__cxx11::string::string((string *)&this->_typeDesc,(string *)typeDesc);
  this->_constraint = (Constraint<double> *)0x0;
  (*parser->_vptr_CmdLineInterface[3])(parser,this);
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      CmdLineInterface& parser,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ 
    parser.add( this );
}